

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeUnsignedInteger
          (ParserImpl *this,uint64_t *value,uint64_t max_value)

{
  bool bVar1;
  AlphaNum *this_00;
  AlphaNum *in_R8;
  string_view message;
  string_view message_00;
  undefined1 local_d0 [32];
  AlphaNum local_b0;
  AlphaNum local_80;
  string_view local_50 [3];
  
  if ((this->tokenizer_).current_.type == TYPE_INTEGER) {
    bVar1 = io::Tokenizer::ParseInteger(&(this->tokenizer_).current_.text,max_value,value);
    if (bVar1) {
      io::Tokenizer::Next(&this->tokenizer_);
      return true;
    }
    local_50[0] = absl::lts_20250127::NullSafeStringView("Integer out of range (");
    local_80.piece_._M_str = (this->tokenizer_).current_.text._M_dataplus._M_p;
    local_80.piece_._M_len = (this->tokenizer_).current_.text._M_string_length;
    local_b0.piece_ = absl::lts_20250127::NullSafeStringView(")");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_d0,(lts_20250127 *)local_50,&local_80,&local_b0,in_R8);
    message_00._M_str = (char *)local_d0._0_8_;
    message_00._M_len = local_d0._8_8_;
    ReportError(this,message_00);
    this_00 = (AlphaNum *)local_d0;
  }
  else {
    local_50[0] = absl::lts_20250127::NullSafeStringView("Expected integer, got: ");
    local_80.piece_._M_str = (this->tokenizer_).current_.text._M_dataplus._M_p;
    local_80.piece_._M_len = (this->tokenizer_).current_.text._M_string_length;
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_b0,(lts_20250127 *)local_50,&local_80,
               (AlphaNum *)local_80.piece_._M_len);
    message._M_str = (char *)local_b0.piece_._M_len;
    message._M_len = (size_t)local_b0.piece_._M_str;
    ReportError(this,message);
    this_00 = &local_b0;
  }
  std::__cxx11::string::~string((string *)this_00);
  return false;
}

Assistant:

bool ConsumeUnsignedInteger(uint64_t* value, uint64_t max_value) {
    if (!LookingAtType(io::Tokenizer::TYPE_INTEGER)) {
      ReportError(
          absl::StrCat("Expected integer, got: ", tokenizer_.current().text));
      return false;
    }

    if (!io::Tokenizer::ParseInteger(tokenizer_.current().text, max_value,
                                     value)) {
      ReportError(absl::StrCat("Integer out of range (",
                               tokenizer_.current().text, ")"));
      return false;
    }

    tokenizer_.Next();
    return true;
  }